

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveArrayObject.cpp
# Opt level: O2

string * __thiscall
PrimitiveArrayObject::GetTypename_abi_cxx11_
          (string *__return_storage_ptr__,PrimitiveArrayObject *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(this->simple_object_->super_PrimitiveObject).super_Object._vptr_Object)(&local_30);
  std::operator+(__return_storage_ptr__,&local_30,"[]");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveArrayObject::GetTypename() {
  return simple_object_->GetTypename() + "[]";
}